

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

void * loadsym(MOJOSHADER_glGetProcAddress lookup,void *d,char *fn,int *ext)

{
  void *local_30;
  void *retval;
  int *ext_local;
  char *fn_local;
  void *d_local;
  MOJOSHADER_glGetProcAddress lookup_local;
  
  local_30 = (void *)0x0;
  if (lookup != (MOJOSHADER_glGetProcAddress)0x0) {
    local_30 = (*lookup)(fn,d);
  }
  if (local_30 == (void *)0x0) {
    *ext = 0;
  }
  return local_30;
}

Assistant:

static void *loadsym(MOJOSHADER_glGetProcAddress lookup, void *d,
                     const char *fn, int *ext)
{
    void *retval = NULL;
    if (lookup != NULL)
        retval = lookup(fn, d);

    if (retval == NULL)
        *ext = 0;

    return retval;
}